

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.c
# Opt level: O2

void * readerThread(void *arg)

{
  dsList *list;
  dsListEntry *entry;
  
  dsOpen("myCrate",0,1);
  list = (dsList *)dsGetIndex();
  for (entry = dsListBegin(list); entry != (dsListEntry *)0x0; entry = dsListNext(entry)) {
    dsListData(entry);
  }
  return (void *)0x0;
}

Assistant:

static void *
readerThread(void *arg)
{
	dsCrate *crate = dsOpen("myCrate", 0, 1);

	dsList *list = dsGetIndex();

	dsListEntry *e;
	for (e = dsListBegin(list); e != NULL; e = dsListNext(e)) {
		int *data = dsListData(e);
	}

	return(NULL);
}